

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::PopulateExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          string *errorMessage)

{
  bool bVar1;
  cmPropertyMap *this_00;
  char *pcVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  string *psVar5;
  pointer str1;
  string evaluatedValue;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  string local_1e8;
  allocator<char> local_1c8 [32];
  ostream local_1a8;
  
  this_00 = cmTarget::GetProperties(gte->Target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"EXPORT_PROPERTIES",(allocator<char> *)&local_1e8);
  pcVar2 = cmPropertyMap::GetPropertyValue(this_00,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,pcVar2,(allocator<char> *)&local_1e8);
    cmSystemTools::ExpandedListArgument(&local_200,(string *)&local_1a8,false);
    std::__cxx11::string::~string((string *)&local_1a8);
    for (str1 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        str1 != local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; str1 = str1 + 1) {
      bVar1 = cmsys::SystemTools::StringStartsWith(str1,"IMPORTED_");
      if ((bVar1) || (bVar1 = cmsys::SystemTools::StringStartsWith(str1,"INTERFACE_"), bVar1)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        poVar4 = std::operator<<(&local_1a8,"Target \"");
        psVar5 = cmTarget::GetName_abi_cxx11_(gte->Target);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\" contains property \"");
        poVar4 = std::operator<<(poVar4,(string *)str1);
        poVar4 = std::operator<<(poVar4,"\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* ");
        std::operator<<(poVar4,"properties are reserved.");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_00221c0a:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_200);
        return false;
      }
      pcVar2 = cmPropertyMap::GetPropertyValue(this_00,str1);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar2,local_1c8);
        cmGeneratorExpression::Preprocess
                  (&local_1e8,(string *)&local_1a8,StripAllGeneratorExpressions,false);
        std::__cxx11::string::~string((string *)&local_1a8);
        bVar1 = std::operator!=(&local_1e8,pcVar2);
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          poVar4 = std::operator<<(&local_1a8,"Target \"");
          psVar5 = cmTarget::GetName_abi_cxx11_(gte->Target);
          poVar4 = std::operator<<(poVar4,(string *)psVar5);
          poVar4 = std::operator<<(poVar4,"\" contains property \"");
          poVar4 = std::operator<<(poVar4,(string *)str1);
          poVar4 = std::operator<<(poVar4,"\" in EXPORT_PROPERTIES but this property contains a ");
          std::operator<<(poVar4,"generator expression. This is not allowed.");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)errorMessage,(string *)local_1c8);
          std::__cxx11::string::~string((string *)local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1e8);
          goto LAB_00221c0a;
        }
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,str1);
        std::__cxx11::string::assign((char *)pmVar3);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_200);
  }
  return true;
}

Assistant:

bool cmExportFileGenerator::PopulateExportProperties(
  cmGeneratorTarget* gte, ImportPropertyMap& properties,
  std::string& errorMessage)
{
  auto& targetProperties = gte->Target->GetProperties();
  if (const char* exportProperties =
        targetProperties.GetPropertyValue("EXPORT_PROPERTIES")) {
    for (auto& prop : cmSystemTools::ExpandedListArgument(exportProperties)) {
      /* Black list reserved properties */
      if (cmSystemTools::StringStartsWith(prop, "IMPORTED_") ||
          cmSystemTools::StringStartsWith(prop, "INTERFACE_")) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* "
          << "properties are reserved.";
        errorMessage = e.str();
        return false;
      }
      auto propertyValue = targetProperties.GetPropertyValue(prop);
      if (propertyValue == nullptr) {
        // Asked to export a property that isn't defined on the target. Do not
        // consider this an error, there's just nothing to export.
        continue;
      }
      std::string evaluatedValue = cmGeneratorExpression::Preprocess(
        propertyValue, cmGeneratorExpression::StripAllGeneratorExpressions);
      if (evaluatedValue != propertyValue) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but this property contains a "
          << "generator expression. This is not allowed.";
        errorMessage = e.str();
        return false;
      }
      properties[prop] = propertyValue;
    }
  }
  return true;
}